

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O1

bool InfoListWnd::ToggleDisplay(int _force)

{
  bool bVar1;
  InfoListWnd *this;
  
  if (_force == 0) {
    if (gpILW == (InfoListWnd *)0x0) {
      _force = 1;
    }
    else {
      bVar1 = ImgWindow::GetVisible((ImgWindow *)gpILW);
      _force = -(uint)bVar1 | 1;
    }
  }
  if (_force < 1) {
    if (gpILW != (InfoListWnd *)0x0) {
      (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
    }
  }
  else {
    if (gpILW == (InfoListWnd *)0x0) {
      this = (InfoListWnd *)operator_new(0x300);
      InfoListWnd(this,WND_MODE_FLOAT_CNT_VR);
      gpILW = this;
    }
    (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(gpILW,1);
    XPLMBringWindowToFront((gpILW->super_LTImgWindow).super_ImgWindow.mWindowID);
  }
  return 0 < _force;
}

Assistant:

bool InfoListWnd::ToggleDisplay (int _force)
{
    // If we toggle then do what current is not the state
    if (!_force)
        _force = InfoListWnd::IsDisplayed() ? -1 : 1;
    
    // Open the window?
    if (_force > 0)
    {
        // Create the object and window if needed
        if (!gpILW)
            gpILW = new InfoListWnd();
        // Ensure it is visible
        gpILW->SetVisible(true);
        gpILW->BringWindowToFront();
        return true;                    // visible now
    }
    // Close the window
    else
    {
        if (gpILW)                      // just remove the object
            delete gpILW;               // (destructor clears gpILW)
        return false;                   // not visible
    }
}